

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyNLSC.hpp
# Opt level: O2

void njoy::ENDFtk::section::Type<2,_151>::ReichMoore::verifyNLSC(int NLS,int NLSC)

{
  char *in_RAX;
  undefined8 *puVar1;
  
  if (NLS <= NLSC) {
    return;
  }
  tools::Log::error<char_const*>(in_RAX);
  tools::Log::info<char_const*>(in_RAX);
  tools::Log::info<char_const*,int>("NLS value: {}",NLS);
  tools::Log::info<char_const*,int>("NLSC value: {}",NLSC);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifyNLSC( int NLS, int NLSC ) {

  if ( NLSC < NLS ) {

    Log::error( "Encountered illegal NLSC value" );
    Log::info( "NLSC is required to be greater than or equal to NLS" );
    Log::info( "NLS value: {}", NLS );
    Log::info( "NLSC value: {}", NLSC );
    throw std::exception();
  }
}